

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

int libcellml::convertPrefixToInt(string *in,bool *ok)

{
  bool bVar1;
  mapped_type_conflict2 *pmVar2;
  ulong uVar3;
  int local_1c;
  bool success;
  bool *pbStack_18;
  int prefixInt;
  bool *ok_local;
  string *in_local;
  
  local_1c = 0;
  if (ok != (bool *)0x0) {
    *ok = true;
  }
  pbStack_18 = ok;
  ok_local = (bool *)in;
  bVar1 = isStandardPrefixName(in);
  if (bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)standardPrefixList_abi_cxx11_,(key_type *)ok_local);
    local_1c = *pmVar2;
  }
  else {
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) &&
       (bVar1 = convertToInt((string *)ok_local,&local_1c), pbStack_18 != (bool *)0x0)) {
      *pbStack_18 = bVar1;
    }
  }
  return local_1c;
}

Assistant:

int convertPrefixToInt(const std::string &in, bool *ok)
{
    int prefixInt = 0;

    if (ok != nullptr) {
        *ok = true;
    }

    if (isStandardPrefixName(in)) {
        prefixInt = standardPrefixList.at(in);
    } else if (!in.empty()) {
        bool success = convertToInt(in, prefixInt);
        if (ok != nullptr) {
            *ok = success;
        }
    }
    return prefixInt;
}